

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

BitSelectSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::BitSelectSyntax,slang::syntax::BitSelectSyntax_const&>
          (BumpAllocator *this,BitSelectSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ExpressionSyntax *pEVar3;
  undefined4 uVar4;
  BitSelectSyntax *pBVar5;
  
  pBVar5 = (BitSelectSyntax *)allocate(this,0x20,8);
  uVar4 = *(undefined4 *)&(args->super_SelectorSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_SelectorSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_SelectorSyntax).super_SyntaxNode.previewNode;
  pEVar3 = (args->expr).ptr;
  (pBVar5->super_SelectorSyntax).super_SyntaxNode.kind =
       (args->super_SelectorSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pBVar5->super_SelectorSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pBVar5->super_SelectorSyntax).super_SyntaxNode.parent = pSVar1;
  (pBVar5->super_SelectorSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pBVar5->expr).ptr = pEVar3;
  return pBVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }